

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  bool bVar3;
  Token token;
  string local_68;
  Token local_48;
  
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->current_ = beginDoc;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (&this->errors_);
  while (ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur,
        ppVVar2 !=
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_68._M_dataplus._M_p = (pointer)root;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_68);
  }
  else {
    *ppVVar2 = root;
    piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  bVar3 = readValue(this);
  do {
    readToken(this,&local_48);
  } while (local_48.type_ == tokenComment);
  if ((7 < (byte)root->field_0x8) || ((0xc1U >> ((byte)root->field_0x8 & 0x1f) & 1) == 0)) {
    local_48.type_ = tokenError;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_48.start_ = beginDoc;
    local_48.end_ = endDoc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "A valid JSON document must be either an array or an object value.","");
    addError(this,&local_68,&local_48,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
Reader::parse ( const char* beginDoc, const char* endDoc,
                Value& root)
{
    begin_ = beginDoc;
    end_ = endDoc;
    current_ = begin_;
    lastValueEnd_ = 0;
    lastValue_ = 0;
    errors_.clear ();

    while ( !nodes_.empty () )
        nodes_.pop ();

    nodes_.push ( &root );

    bool successful = readValue ();
    Token token;
    skipCommentTokens ( token );

    if ( !root.isArray ()  &&  !root.isObject () )
    {
        // Set error location to start of doc, ideally should be first token found in doc
        token.type_ = tokenError;
        token.start_ = beginDoc;
        token.end_ = endDoc;
        addError ( "A valid JSON document must be either an array or an object value.",
                   token );
        return false;
    }

    return successful;
}